

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void os_banner_set_screen_color(void *banner_handle,os_color_t color)

{
  char cVar1;
  int iVar2;
  osgen_win_t *in_RSI;
  long in_RDI;
  osgen_win_t *win;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  
  cVar1 = osgen_xlat_color_t((os_color_t)in_RSI);
  *(char *)(in_RDI + 0x68) = cVar1;
  iVar2 = ossgetcolor(in_stack_00000020,in_stack_0000001c,in_stack_00000018,banner_handle._4_4_);
  *(int *)(in_RDI + 0x6c) = iVar2;
  if ((S_deferred_redraw == 0) && ((*(uint *)(in_RDI + 4) & 4) == 0)) {
    osgen_redraw_win(in_RSI);
  }
  return;
}

Assistant:

void os_banner_set_screen_color(void *banner_handle, os_color_t color)
{
    osgen_win_t *win = (osgen_win_t *)banner_handle;

    /* set the new background color in the window */
    win->fillcolor = osgen_xlat_color_t(color);
    win->oss_fillcolor = ossgetcolor(OSGEN_COLOR_TEXT, win->fillcolor, 0, 0);

    /* redraw the window if we don't have a redraw scheduled already */
    if (!S_deferred_redraw && !(win->flags & OSGEN_DEFER_REDRAW))
        osgen_redraw_win(win);
}